

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase411::run(TestCase411 *this)

{
  Side SVar1;
  RefOrVoid<kj::AsyncIoProvider> ioProvider;
  RefOrVoid<kj::AsyncIoStream> connection;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  bool local_369;
  undefined1 local_368 [7];
  bool _kj_shouldLog_1;
  Side local_336;
  Side_9fd69ebc87b9719c local_334;
  bool local_331;
  undefined1 local_330 [7];
  bool _kj_shouldLog;
  Maybe<capnp::MessageSize> local_300;
  undefined1 local_2e8 [40];
  Request<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdParams,_capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
  local_2c0;
  Request<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdParams,_capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
  local_288;
  undefined1 local_250 [8];
  Response<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
  resp;
  TwoPartyClient client;
  undefined1 local_70 [8];
  PipeThread serverThread;
  TestBootstrapFactory bootstrapFactory;
  AsyncIoContext ioContext;
  TestCase411 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  kj::setupAsyncIo();
  TestBootstrapFactory::TestBootstrapFactory((TestBootstrapFactory *)&serverThread.pipe.ptr);
  ioProvider = kj::Own<kj::AsyncIoProvider>::operator*
                         ((Own<kj::AsyncIoProvider> *)&ioContext.lowLevelProvider.ptr);
  runAuthenticatingServer
            ((PipeThread *)local_70,ioProvider,
             (BootstrapFactory<capnp::rpc::twoparty::VatId> *)&serverThread.pipe.ptr);
  connection = kj::Own<kj::AsyncIoStream>::operator*
                         ((Own<kj::AsyncIoStream> *)&serverThread.thread.ptr);
  TwoPartyClient::TwoPartyClient((TwoPartyClient *)&resp.hook.ptr,connection);
  TwoPartyClient::bootstrap((TwoPartyClient *)local_2e8);
  Capability::Client::
  castAs<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>>
            ((Client *)(local_2e8 + 0x10),(Client *)local_2e8);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_300,(void *)0x0);
  capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::Client::
  getCallerIdRequest(&local_2c0,(Client *)(local_2e8 + 0x10),&local_300);
  Request<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdParams,_capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
  ::send(&local_288,(int)&local_2c0,__buf,in_RCX,in_R8D);
  kj::
  Promise<capnp::Response<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>_>
          *)local_250,&local_288);
  RemotePromise<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
  ::~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
                    *)&local_288);
  Request<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdParams,_capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
  ::~Request(&local_2c0);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_300);
  capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::Client::
  ~Client((Client *)(local_2e8 + 0x10));
  Capability::Client::~Client((Client *)local_2e8);
  capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::
  GetCallerIdResults::Reader::getCaller
            ((ReaderFor<capnp::rpc::twoparty::VatId> *)local_330,(Reader *)local_250);
  SVar1 = rpc::twoparty::VatId::Reader::getSide((Reader *)local_330);
  if (SVar1 != CLIENT) {
    local_331 = kj::_::Debug::shouldLog(ERROR);
    while (local_331 != false) {
      local_334 = CLIENT;
      capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::
      GetCallerIdResults::Reader::getCaller
                ((ReaderFor<capnp::rpc::twoparty::VatId> *)local_368,(Reader *)local_250);
      local_336 = rpc::twoparty::VatId::Reader::getSide((Reader *)local_368);
      kj::_::Debug::
      log<char_const(&)[79],capnp::schemas::Side_9fd69ebc87b9719c,capnp::schemas::Side_9fd69ebc87b9719c>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x1a2,ERROR,
                 "\"failed: expected \" \"(rpc::twoparty::Side::CLIENT) == (resp.getCaller().getSide())\", rpc::twoparty::Side::CLIENT, resp.getCaller().getSide()"
                 ,(char (*) [79])
                  "failed: expected (rpc::twoparty::Side::CLIENT) == (resp.getCaller().getSide())",
                 &local_334,&local_336);
      local_331 = false;
    }
  }
  if (((byte)bootstrapFactory.super_BootstrapFactory<capnp::rpc::twoparty::VatId>.
             super_BootstrapFactoryBase._vptr_BootstrapFactoryBase & 1) == 0) {
    local_369 = kj::_::Debug::shouldLog(ERROR);
    while (local_369 != false) {
      kj::_::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x1a3,ERROR,"\"failed: expected \" \"bootstrapFactory.called\"",
                 (char (*) [41])"failed: expected bootstrapFactory.called");
      local_369 = false;
    }
  }
  Response<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
  ::~Response((Response<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
               *)local_250);
  TwoPartyClient::~TwoPartyClient((TwoPartyClient *)&resp.hook.ptr);
  kj::AsyncIoProvider::PipeThread::~PipeThread((PipeThread *)local_70);
  kj::AsyncIoContext::~AsyncIoContext((AsyncIoContext *)&bootstrapFactory.called);
  return;
}

Assistant:

TEST(TwoPartyNetwork, BootstrapFactory) {
  auto ioContext = kj::setupAsyncIo();
  TestBootstrapFactory bootstrapFactory;
  auto serverThread = runAuthenticatingServer(*ioContext.provider, bootstrapFactory);
  TwoPartyClient client(*serverThread.pipe);
  auto resp = client.bootstrap().castAs<test::TestAuthenticatedBootstrap<rpc::twoparty::VatId>>()
      .getCallerIdRequest().send().wait(ioContext.waitScope);
  EXPECT_EQ(rpc::twoparty::Side::CLIENT, resp.getCaller().getSide());
  EXPECT_TRUE(bootstrapFactory.called);
}